

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp.hpp
# Opt level: O2

uint64_t duckdb::alp::AlpCompression<float,_true>::DryCompressToEstimateSize<true>
                   (vector<float,_true> *input_vector,AlpEncodingIndices encoding_indices)

{
  float *pfVar1;
  long lVar2;
  int64_t encoded_value;
  uint64_t uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  const_iterator __begin0;
  float *pfVar7;
  float fVar8;
  __type_conflict6 __x;
  double dVar9;
  long local_48;
  const_iterator __end0;
  
  lVar6 = 0x7fffffffffffffff;
  pfVar7 = (input_vector->super_vector<float,_std::allocator<float>_>).
           super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pfVar1 = (input_vector->super_vector<float,_std::allocator<float>_>).
           super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  lVar2 = (long)pfVar1 - (long)pfVar7;
  lVar4 = -0x8000000000000000;
  uVar5 = 0;
  local_48 = 0;
  for (; pfVar7 != pfVar1; pfVar7 = pfVar7 + 1) {
    encoded_value = EncodeValue(*pfVar7,encoding_indices);
    fVar8 = DecodeValue(encoded_value,encoding_indices);
    if ((fVar8 != *pfVar7) || (NAN(fVar8) || NAN(*pfVar7))) {
      local_48 = local_48 + 1;
    }
    else {
      uVar5 = uVar5 + 1;
      if (lVar4 < encoded_value) {
        lVar4 = encoded_value;
      }
      if (encoded_value < lVar6) {
        lVar6 = encoded_value;
      }
    }
  }
  if (uVar5 < 2) {
    uVar3 = 0xffffffffffffffff;
  }
  else {
    __x = ::std::log2<unsigned_long>((lVar4 - lVar6) + 1);
    dVar9 = ceil(__x);
    uVar3 = local_48 * 0x30 + ((long)dVar9 & 0xffffffffU) * (lVar2 >> 2);
  }
  return uVar3;
}

Assistant:

static uint64_t DryCompressToEstimateSize(const vector<T> &input_vector, AlpEncodingIndices encoding_indices) {
		idx_t n_values = input_vector.size();
		idx_t exceptions_count = 0;
		idx_t non_exceptions_count = 0;
		uint32_t estimated_bits_per_value = 0;
		uint64_t estimated_compression_size = 0;
		int64_t max_encoded_value = NumericLimits<int64_t>::Minimum();
		int64_t min_encoded_value = NumericLimits<int64_t>::Maximum();

		for (const T &value : input_vector) {
			int64_t encoded_value = EncodeValue(value, encoding_indices);
			T decoded_value = DecodeValue(encoded_value, encoding_indices);
			if (decoded_value == value) {
				non_exceptions_count++;
				max_encoded_value = MaxValue(encoded_value, max_encoded_value);
				min_encoded_value = MinValue(encoded_value, min_encoded_value);
				continue;
			}
			exceptions_count++;
		}

		// We penalize combinations which yields to almost all exceptions
		if (PENALIZE_EXCEPTIONS && non_exceptions_count < 2) {
			return NumericLimits<uint64_t>::Maximum();
		}

		// Evaluate factor/exponent compression size (we optimize for FOR)
		uint64_t delta = (static_cast<uint64_t>(max_encoded_value) - static_cast<uint64_t>(min_encoded_value));
		estimated_bits_per_value = ExactNumericCast<uint32_t>(std::ceil(std::log2(delta + 1)));
		estimated_compression_size += n_values * estimated_bits_per_value;
		estimated_compression_size +=
		    exceptions_count * (EXACT_TYPE_BITSIZE + (AlpConstants::EXCEPTION_POSITION_SIZE * 8));
		return estimated_compression_size;
	}